

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  float *pfVar4;
  float *extraout_RAX;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *y;
  int iVar9;
  float *x;
  float fVar10;
  __m256 afVar11;
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  __m128 afVar14;
  binary_op_atan2 op;
  __m256 _p1;
  __m256 _p;
  binary_op_atan2 local_f5;
  uint local_f4;
  void *local_f0;
  Mat *local_e8;
  Mat *local_e0;
  Mat *local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  void *local_b0;
  ulong local_a8;
  __m256 local_a0;
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  local_f4 = a->h * a->w * a->d * a->elempack;
  pfVar4 = (float *)(ulong)local_f4;
  local_a8 = 0;
  local_e8 = b;
  local_e0 = a;
  local_d8 = c;
  local_d0 = (ulong)(uint)a->c;
  if (a->c < 1) {
    local_d0 = local_a8;
  }
  while (local_a8 != local_d0) {
    pvVar1 = local_e0->data;
    local_b8 = local_e8->data;
    local_c8 = local_e8->elemsize * local_e8->cstep * local_a8;
    lVar5 = local_d8->elemsize * local_d8->cstep * local_a8;
    pvVar2 = local_d8->data;
    local_f0 = (void *)((long)local_b8 + local_c8);
    lVar6 = local_e0->elemsize * local_e0->cstep * local_a8;
    lVar7 = 0;
    lVar8 = 0;
    local_c0 = lVar6;
    local_b0 = pvVar1;
    for (iVar9 = 0; iVar9 + 7 < (int)local_f4; iVar9 = iVar9 + 8) {
      pfVar4 = (float *)((long)pvVar1 + lVar8 + lVar6);
      local_80 = *(float (*) [2])pfVar4;
      afStack_78 = *(float (*) [2])(pfVar4 + 2);
      afStack_70 = *(float (*) [2])(pfVar4 + 4);
      afStack_68._0_8_ = *(undefined8 *)(pfVar4 + 6);
      local_a0 = *(__m256 *)((long)local_f0 + lVar8);
      afVar11 = local_a0;
      BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8(&local_f5,(__m256 *)local_80,&local_a0);
      *(__m256 *)((long)pvVar2 + lVar8 + lVar5) = afVar11;
      lVar8 = lVar8 + 0x20;
      lVar7 = lVar7 + 8;
    }
    for (; uVar3 = local_a8, iVar9 + 3 < (int)local_f4; iVar9 = iVar9 + 4) {
      pfVar4 = (float *)((long)pvVar1 + lVar8 + lVar6);
      local_80 = *(float (*) [2])pfVar4;
      afStack_78 = *(float (*) [2])(pfVar4 + 2);
      local_a0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + lVar8);
      auVar13 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_f0 + lVar8) + 8));
      afVar14 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                          (&local_f5,(__m128 *)local_80,(__m128 *)local_a0);
      auVar12._0_8_ = afVar14._0_8_;
      auVar12._8_56_ = auVar13;
      *(undefined1 (*) [16])((long)pvVar2 + lVar8 + lVar5) = auVar12._0_16_;
      lVar8 = lVar8 + 0x10;
      lVar7 = lVar7 + 4;
    }
    pfVar4 = (float *)((long)local_b8 + local_c8 + lVar8);
    x = (float *)((long)local_b0 + local_c0 + lVar8);
    y = pfVar4;
    for (; (int)lVar7 < (int)local_f4; lVar7 = lVar7 + 1) {
      fVar10 = BinaryOp_x86_fma_functor::binary_op_atan2::func(&local_f5,x,y);
      *(float *)((long)pvVar2 + lVar7 * 4 + lVar5) = fVar10;
      x = x + 1;
      y = y + 1;
      pfVar4 = extraout_RAX;
    }
    local_a8 = uVar3 + 1;
  }
  return (int)pfVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}